

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

FillLikeLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_filllike(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x438) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x438;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x18);
    FillLikeLayerParams::FillLikeLayerParams(this_00.filllike_);
    (this->layer_).filllike_ = (FillLikeLayerParams *)this_00;
  }
  return (FillLikeLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::FillLikeLayerParams* NeuralNetworkLayer::mutable_filllike() {
  if (!has_filllike()) {
    clear_layer();
    set_has_filllike();
    layer_.filllike_ = new ::CoreML::Specification::FillLikeLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.fillLike)
  return layer_.filllike_;
}